

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

ip_chain_t * find_chain(char *name,ip_table_t *ipt)

{
  int iVar1;
  list_head *plVar2;
  ip_chain_t *__s2;
  
  iVar1 = map_int_get_v(name,m_chain);
  if ((iVar1 == 5) || (__s2 = ipt->chains[iVar1], __s2 == (ip_chain_t *)0x0)) {
    plVar2 = &ipt->child_chains;
    do {
      plVar2 = plVar2->next;
      if (plVar2 == &ipt->child_chains) {
        return (ip_chain_t *)0x0;
      }
      __s2 = (ip_chain_t *)&plVar2[-3].prev;
      iVar1 = strcmp(name,(char *)__s2);
    } while (iVar1 != 0);
  }
  return __s2;
}

Assistant:

static ip_chain_t *find_chain(const char *name, ip_table_t *ipt)
{
	int c = map_int_get_v(name, m_chain);
	ip_chain_t *p = NULL;

	if (c != CHAIN_NONE && ipt->chains[c] != NULL) {
		return ipt->chains[c];
	}

	list_for_each_entry(p, &ipt->child_chains, list) {
		if (strcmp(name, p->name) == 0) {
			return p;
		}
	}

	return NULL;
}